

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fe4_canon(uint64_t *out1,uint64_t *arg1)

{
  uint64_t local_d8;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t uStack_b0;
  fiat_uint1 x20;
  uint64_t x19;
  uint64_t uStack_a0;
  fiat_uint1 x18;
  uint64_t x17;
  uint64_t uStack_90;
  fiat_uint1 x16;
  uint64_t x15;
  uint64_t uStack_80;
  fiat_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t uStack_50;
  fiat_uint1 x8;
  uint64_t x7;
  uint64_t uStack_40;
  fiat_uint1 x6;
  uint64_t x5;
  uint64_t uStack_30;
  fiat_uint1 x4;
  uint64_t x3;
  uint64_t uStack_20;
  fiat_uint1 x2;
  uint64_t x1;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg1;
  arg1_local = out1;
  fiat_subborrowx_u64(&stack0xffffffffffffffe0,(fiat_uint1 *)((long)&x3 + 7),'\0',*arg1,
                      0xffffffffffffffed);
  fiat_subborrowx_u64(&stack0xffffffffffffffd0,(fiat_uint1 *)((long)&x5 + 7),x3._7_1_,
                      *(uint64_t *)(x1 + 8),0xffffffffffffffff);
  fiat_subborrowx_u64(&stack0xffffffffffffffc0,(fiat_uint1 *)((long)&x7 + 7),x5._7_1_,
                      *(uint64_t *)(x1 + 0x10),0xffffffffffffffff);
  fiat_subborrowx_u64(&stack0xffffffffffffffb0,(fiat_uint1 *)((long)&x9 + 7),x7._7_1_,
                      *(uint64_t *)(x1 + 0x18),0x7fffffffffffffff);
  fiat_cmovznz_u64(&x10,x9._7_1_,uStack_20,*(uint64_t *)x1);
  fiat_cmovznz_u64(&x11,x9._7_1_,uStack_30,*(uint64_t *)(x1 + 8));
  fiat_cmovznz_u64(&x12,x9._7_1_,uStack_40,*(uint64_t *)(x1 + 0x10));
  fiat_cmovznz_u64(&x13,x9._7_1_,uStack_50,*(uint64_t *)(x1 + 0x18));
  fiat_subborrowx_u64(&stack0xffffffffffffff80,(fiat_uint1 *)((long)&x15 + 7),'\0',x10,
                      0xffffffffffffffed);
  fiat_subborrowx_u64(&stack0xffffffffffffff70,(fiat_uint1 *)((long)&x17 + 7),x15._7_1_,x11,
                      0xffffffffffffffff);
  fiat_subborrowx_u64(&stack0xffffffffffffff60,(fiat_uint1 *)((long)&x19 + 7),x17._7_1_,x12,
                      0xffffffffffffffff);
  fiat_subborrowx_u64(&stack0xffffffffffffff50,(fiat_uint1 *)((long)&x21 + 7),x19._7_1_,x13,
                      0x7fffffffffffffff);
  fiat_cmovznz_u64(&x22,x21._7_1_,uStack_80,x10);
  fiat_cmovznz_u64(&x23,x21._7_1_,uStack_90,x11);
  fiat_cmovznz_u64(&x24,x21._7_1_,uStack_a0,x12);
  fiat_cmovznz_u64(&local_d8,x21._7_1_,uStack_b0,x13);
  *arg1_local = x22;
  arg1_local[1] = x23;
  arg1_local[2] = x24;
  arg1_local[3] = local_d8;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_canon(uint64_t out1[4], const uint64_t arg1[4]) {
  uint64_t x1;
  fiat_uint1 x2;
  uint64_t x3;
  fiat_uint1 x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  fiat_uint1 x8;
  uint64_t x9;
  uint64_t x10;
  uint64_t x11;
  uint64_t x12;
  uint64_t x13;
  fiat_uint1 x14;
  uint64_t x15;
  fiat_uint1 x16;
  uint64_t x17;
  fiat_uint1 x18;
  uint64_t x19;
  fiat_uint1 x20;
  uint64_t x21;
  uint64_t x22;
  uint64_t x23;
  uint64_t x24;
  fiat_subborrowx_u64(&x1, &x2, 0x0, (arg1[0]), UINT64_C(0xffffffffffffffed));
  fiat_subborrowx_u64(&x3, &x4, x2, (arg1[1]), UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x5, &x6, x4, (arg1[2]), UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x7, &x8, x6, (arg1[3]), UINT64_C(0x7fffffffffffffff));
  fiat_cmovznz_u64(&x9, x8, x1, (arg1[0]));
  fiat_cmovznz_u64(&x10, x8, x3, (arg1[1]));
  fiat_cmovznz_u64(&x11, x8, x5, (arg1[2]));
  fiat_cmovznz_u64(&x12, x8, x7, (arg1[3]));
  fiat_subborrowx_u64(&x13, &x14, 0x0, x9, UINT64_C(0xffffffffffffffed));
  fiat_subborrowx_u64(&x15, &x16, x14, x10, UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x17, &x18, x16, x11, UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x19, &x20, x18, x12, UINT64_C(0x7fffffffffffffff));
  fiat_cmovznz_u64(&x21, x20, x13, x9);
  fiat_cmovznz_u64(&x22, x20, x15, x10);
  fiat_cmovznz_u64(&x23, x20, x17, x11);
  fiat_cmovznz_u64(&x24, x20, x19, x12);
  out1[0] = x21;
  out1[1] = x22;
  out1[2] = x23;
  out1[3] = x24;
}